

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

bool __thiscall jrtplib::RTPUDPv6Transmitter::SetMulticastTTL(RTPUDPv6Transmitter *this,uint8_t ttl)

{
  int iVar1;
  uint local_20;
  int status;
  int ttl2;
  uint8_t ttl_local;
  RTPUDPv6Transmitter *this_local;
  
  local_20 = (uint)ttl;
  status._3_1_ = ttl;
  _ttl2 = this;
  iVar1 = setsockopt(this->rtpsock,0x29,0x12,&local_20,4);
  if (iVar1 == 0) {
    iVar1 = setsockopt(this->rtcpsock,0x29,0x12,&local_20,4);
    if (iVar1 == 0) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RTPUDPv6Transmitter::SetMulticastTTL(uint8_t ttl)
{
	int ttl2,status;

	ttl2 = (int)ttl;
	status = setsockopt(rtpsock,IPPROTO_IPV6,IPV6_MULTICAST_HOPS,(const char *)&ttl2,sizeof(int));
	if (status != 0)
		return false;
	status = setsockopt(rtcpsock,IPPROTO_IPV6,IPV6_MULTICAST_HOPS,(const char *)&ttl2,sizeof(int));
	if (status != 0)
		return false;
	return true;
}